

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qo_manager.cc
# Opt level: O3

bool __thiscall QO_Manager::UseCondition(QO_Manager *this,int relsJoined,int condIndex,int relIdx)

{
  Condition *pCVar1;
  bool bVar2;
  RelAttr attr;
  RelAttr attr_00;
  RelAttr attr_01;
  int firstRel_1;
  int secondRel;
  int firstRel;
  int local_34;
  uint local_30;
  uint local_2c;
  
  pCVar1 = this->conds;
  if (pCVar1[condIndex].bRhsIsAttr == 0) {
    attr_01.attrName = pCVar1[condIndex].lhsAttr.attrName;
    attr_01.relName = pCVar1[condIndex].lhsAttr.relName;
    AttrToRelIndex(this,attr_01,&local_34);
    if (local_34 == relIdx) {
      return true;
    }
LAB_001158d8:
    bVar2 = false;
  }
  else {
    attr.attrName = pCVar1[condIndex].lhsAttr.attrName;
    attr.relName = pCVar1[condIndex].lhsAttr.relName;
    AttrToRelIndex(this,attr,(int *)&local_2c);
    attr_00.attrName = this->conds[condIndex].rhsAttr.attrName;
    attr_00.relName = this->conds[condIndex].rhsAttr.relName;
    AttrToRelIndex(this,attr_00,(int *)&local_30);
    if ((1 << ((byte)local_2c & 0x1f) & relsJoined) == 0 && local_2c < 0x21 || local_30 != relIdx) {
      if ((local_2c != relIdx) ||
         (local_30 < 0x21 && (1 << ((byte)local_30 & 0x1f) & relsJoined) == 0)) {
        if (local_30 == relIdx && local_2c == relIdx) {
          return true;
        }
        goto LAB_001158d8;
      }
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool QO_Manager::UseCondition(int relsJoined, int condIndex, int relIdx){
  // If attributes on both sides, one of the attributes must fall within
  // the relation specified by relIdx, and the other must be in a relation
  // specified in relsJoined
  if(conds[condIndex].bRhsIsAttr){
    int firstRel, secondRel;
    AttrToRelIndex(conds[condIndex].lhsAttr, firstRel);
    AttrToRelIndex(conds[condIndex].rhsAttr, secondRel);
    bool firstBitSet = IsBitSet(firstRel, relsJoined);
    bool secondBitSet = IsBitSet(secondRel, relsJoined);
    if(firstBitSet && secondRel == relIdx)
      return true;
    else if(secondBitSet && firstRel == relIdx)
      return true;
    else if(firstRel == relIdx && secondRel == relIdx)
      return true;
  }
  // If attr-value comparison, then the condition must be of the relation
  // specified by relIdx
  else{
    int firstRel;
    AttrToRelIndex(conds[condIndex].lhsAttr, firstRel);
    if(firstRel == relIdx)
      return true;
  }
  return false;
}